

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

RandomNormalStaticLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_randomnormalstatic(NeuralNetworkLayer *this)

{
  RandomNormalStaticLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x497) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x497;
    this_00 = (RandomNormalStaticLayerParams *)operator_new(0x40);
    RandomNormalStaticLayerParams::RandomNormalStaticLayerParams(this_00);
    (this->layer_).randomnormalstatic_ = this_00;
  }
  return (RandomNormalStaticLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::RandomNormalStaticLayerParams* NeuralNetworkLayer::mutable_randomnormalstatic() {
  if (!has_randomnormalstatic()) {
    clear_layer();
    set_has_randomnormalstatic();
    layer_.randomnormalstatic_ = new ::CoreML::Specification::RandomNormalStaticLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.randomNormalStatic)
  return layer_.randomnormalstatic_;
}